

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

void hashSeed(uint8_t *digest,uint8_t *inputSeed,uint8_t *salt,uint8_t hashPrefix,uint repIndex,
             uint nodeIndex,picnic_instance_t *params)

{
  undefined7 in_register_00000009;
  uint capacity;
  uint rate;
  undefined4 in_register_0000008c;
  hash_context ctx;
  undefined2 local_11e;
  uint local_11c;
  uint8_t *local_118;
  Keccak_HashInstance local_110;
  
  local_11e = CONCAT11(local_11e._1_1_,1);
  if (*(char *)(CONCAT44(in_register_0000008c,nodeIndex) + 6) == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_11c = repIndex;
  local_118 = digest;
  Keccak_HashInitialize(&local_110,rate,capacity,0,'\x1f');
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_11e,8);
  Keccak_HashUpdate(&local_110,inputSeed,
                    (ulong)*(byte *)(CONCAT44(in_register_0000008c,nodeIndex) + 7) << 3);
  Keccak_HashUpdate(&local_110,salt,0x100);
  local_11e = (short)CONCAT71(in_register_00000009,hashPrefix);
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_11e,0x10);
  local_11e = (undefined2)local_11c;
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_11e,0x10);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,local_118,
                     (ulong)*(byte *)(CONCAT44(in_register_0000008c,nodeIndex) + 7) << 4);
  return;
}

Assistant:

static void hashSeed(uint8_t* digest, const uint8_t* inputSeed, uint8_t* salt, uint8_t hashPrefix,
                     unsigned int repIndex, unsigned int nodeIndex,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, hashPrefix);
  hash_update(&ctx, inputSeed, params->seed_size);
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, repIndex);
  hash_update_uint16_le(&ctx, nodeIndex);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, 2 * params->seed_size);
  hash_clear(&ctx);
}